

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_stg.c
# Opt level: O1

int cvNlsConvTestSensStg
              (SUNNonlinearSolver NLS,N_Vector ycorStg,N_Vector deltaStg,sunrealtype tol,
              N_Vector ewtStg,void *cvode_mem)

{
  N_Vector *xS;
  N_Vector *wS;
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  int m;
  int local_3c;
  double local_38;
  sunrealtype local_30;
  
  if (cvode_mem == (void *)0x0) {
    iVar2 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x13e,"cvNlsConvTestSensStg",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    xS = *ycorStg->content;
    wS = *ewtStg->content;
    local_30 = tol;
    local_38 = cvSensNorm((CVodeMem)cvode_mem,*deltaStg->content,wS);
    iVar1 = SUNNonlinSolGetCurIter(NLS,&local_3c);
    iVar2 = -0x15;
    if (iVar1 == 0) {
      if (0 < local_3c) {
        dVar4 = *(double *)((long)cvode_mem + 0x548) * 0.3;
        dVar3 = local_38 / *(double *)((long)cvode_mem + 0x550);
        if (dVar4 <= dVar3) {
          dVar4 = dVar3;
        }
        *(double *)((long)cvode_mem + 0x548) = dVar4;
      }
      dVar4 = 1.0;
      if (*(double *)((long)cvode_mem + 0x548) <= 1.0) {
        dVar4 = *(double *)((long)cvode_mem + 0x548);
      }
      if ((dVar4 * local_38) / local_30 <= 1.0) {
        iVar2 = 0;
        if (*(int *)((long)cvode_mem + 0xe0) != 0) {
          if (local_3c != 0) {
            local_38 = cvSensNorm((CVodeMem)cvode_mem,xS,wS);
          }
          *(double *)((long)cvode_mem + 0x570) = local_38;
          *(undefined4 *)((long)cvode_mem + 0x578) = 1;
        }
      }
      else if ((local_3c < 1) ||
              (iVar2 = 0x386,
              local_38 <=
              *(double *)((long)cvode_mem + 0x550) + *(double *)((long)cvode_mem + 0x550))) {
        *(double *)((long)cvode_mem + 0x550) = local_38;
        iVar2 = 0x385;
      }
    }
  }
  return iVar2;
}

Assistant:

static int cvNlsConvTestSensStg(SUNNonlinearSolver NLS, N_Vector ycorStg,
                                N_Vector deltaStg, sunrealtype tol,
                                N_Vector ewtStg, void* cvode_mem)
{
  CVodeMem cv_mem;
  int m, retval;
  sunrealtype Del;
  sunrealtype dcon;
  N_Vector *ycorS, *deltaS, *ewtS;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* extract the current sensitivity corrections */
  ycorS = NV_VECS_SW(ycorStg);

  /* extract the sensitivity deltas */
  deltaS = NV_VECS_SW(deltaStg);

  /* extract the sensitivity error weights */
  ewtS = NV_VECS_SW(ewtStg);

  /* compute the norm of the state and sensitivity corrections */
  Del = cvSensNorm(cv_mem, deltaS, ewtS);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != CV_SUCCESS) { return (CV_MEM_NULL); }

  /* Test for convergence. If m > 0, an estimate of the convergence
     rate constant is stored in crate, and used in the test.

     Recall that, even when errconS=SUNFALSE, all variables are used in the
     convergence test. Hence, we use Del (and not del). However, acnrm is used
     in the error test and thus it has different forms depending on errconS
     (and this explains why we have to carry around del and delS).
  */
  if (m > 0)
  {
    cv_mem->cv_crateS = SUNMAX(CRDOWN * cv_mem->cv_crateS, Del / cv_mem->cv_delp);
  }
  dcon = Del * SUNMIN(ONE, cv_mem->cv_crateS) / tol;

  /* check if nonlinear system was solved successfully */
  if (dcon <= ONE)
  {
    if (cv_mem->cv_errconS)
    {
      cv_mem->cv_acnrmS    = (m == 0) ? Del : cvSensNorm(cv_mem, ycorS, ewtS);
      cv_mem->cv_acnrmScur = SUNTRUE;
    }
    return (CV_SUCCESS);
  }

  /* check if the iteration seems to be diverging */
  if ((m >= 1) && (Del > RDIV * cv_mem->cv_delp))
  {
    return (SUN_NLS_CONV_RECVR);
  }

  /* Save norm of correction and loop again */
  cv_mem->cv_delp = Del;

  /* Not yet converged */
  return (SUN_NLS_CONTINUE);
}